

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall pegmatite::ExprPtr::ExprPtr(ExprPtr *this,char *s)

{
  element_type *peVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  allocator_type local_21;
  
  peVar1 = (element_type *)operator_new(0x20);
  peVar1->_vptr_Expr = (_func_int **)&PTR__StringExpr_00157cf0;
  sVar2 = strlen(s);
  std::vector<char32_t,std::allocator<char32_t>>::vector<char_const*,void>
            ((vector<char32_t,std::allocator<char32_t>> *)(peVar1 + 1),s,s + sVar2,&local_21);
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00158240;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)peVar1;
  (this->super_shared_ptr<pegmatite::Expr>).
  super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  return;
}

Assistant:

ExprPtr::ExprPtr(const char *s) : std::shared_ptr<Expr>(new StringExpr(s)) {}